

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filenames.cc
# Opt level: O2

string_view __thiscall wabt::StripExtension(wabt *this,string_view filename)

{
  size_type __n;
  basic_string_view<char,_std::char_traits<char>_> bVar1;
  string_view sVar2;
  string_view filename_local;
  
  filename_local._M_str = (char *)filename._M_len;
  filename_local._M_len = (size_t)this;
  __n = std::basic_string_view<char,_std::char_traits<char>_>::rfind
                  (&filename_local,'.',0xffffffffffffffff);
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::substr(&filename_local,0,__n);
  sVar2._M_len = bVar1._M_len;
  sVar2._M_str = bVar1._M_str;
  return sVar2;
}

Assistant:

std::string_view StripExtension(std::string_view filename) {
  return filename.substr(0, filename.find_last_of('.'));
}